

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_getnameinfo.c
# Opt level: O0

void append_scopeid(sockaddr_in6 *addr6,uint flags,char *buf,size_t buflen)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  bool local_5d;
  in6_addr *__a;
  size_t bufl;
  char tmpbuf [18];
  int is_mcll;
  int is_ll;
  size_t buflen_local;
  char *buf_local;
  uint flags_local;
  sockaddr_in6 *addr6_local;
  
  bufl._0_1_ = 0x25;
  uVar1 = (addr6->sin6_addr).__in6_u.__u6_addr32[0];
  uVar2 = htonl(0xffc00000);
  uVar3 = htonl(0xfe800000);
  local_5d = false;
  if ((addr6->sin6_addr).__in6_u.__u6_addr8[0] == 0xff) {
    local_5d = ((addr6->sin6_addr).__in6_u.__u6_addr8[1] & 0xf) == 2;
  }
  register0x00000000 = (uint)local_5d;
  if (((flags & 0x80) == 0) && (((uVar1 & uVar2) == uVar3 || (register0x00000000 != 0)))) {
    pcVar4 = if_indextoname(addr6->sin6_scope_id,(char *)((long)&bufl + 1));
    if (pcVar4 == (char *)0x0) {
      snprintf((char *)((long)&bufl + 1),0x11,"%lu",(ulong)addr6->sin6_scope_id);
    }
  }
  else {
    snprintf((char *)((long)&bufl + 1),0x11,"%lu",(ulong)addr6->sin6_scope_id);
  }
  tmpbuf[9] = '\0';
  sVar5 = ares_strlen(buf);
  sVar6 = ares_strlen((char *)&bufl);
  if (sVar5 + sVar6 < buflen) {
    ares_strcpy(buf + sVar5,(char *)&bufl,buflen - sVar5);
  }
  return;
}

Assistant:

static void append_scopeid(const struct sockaddr_in6 *addr6, unsigned int flags,
                           char *buf, size_t buflen)
{
#  ifdef HAVE_IF_INDEXTONAME
  int is_ll;
  int is_mcll;
#  endif
  char   tmpbuf[IF_NAMESIZE + 2];
  size_t bufl;

  tmpbuf[0] = '%';

#  ifdef HAVE_IF_INDEXTONAME
  is_ll   = IN6_IS_ADDR_LINKLOCAL(&addr6->sin6_addr);
  is_mcll = IN6_IS_ADDR_MC_LINKLOCAL(&addr6->sin6_addr);
  if ((flags & ARES_NI_NUMERICSCOPE) || (!is_ll && !is_mcll)) {
    snprintf(&tmpbuf[1], sizeof(tmpbuf) - 1, "%lu",
             (unsigned long)addr6->sin6_scope_id);
  } else {
    if (if_indextoname(addr6->sin6_scope_id, &tmpbuf[1]) == NULL) {
      snprintf(&tmpbuf[1], sizeof(tmpbuf) - 1, "%lu",
               (unsigned long)addr6->sin6_scope_id);
    }
  }
#  else
  snprintf(&tmpbuf[1], sizeof(tmpbuf) - 1, "%lu",
           (unsigned long)addr6->sin6_scope_id);
  (void)flags;
#  endif
  tmpbuf[IF_NAMESIZE + 1] = '\0';
  bufl                    = ares_strlen(buf);

  if (bufl + ares_strlen(tmpbuf) < buflen) {
    /* only append the scopeid string if it fits in the target buffer */
    ares_strcpy(&buf[bufl], tmpbuf, buflen - bufl);
  }
}